

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O2

decimal128_from_chars_result
jsoncons::bson::decimal128_from_chars(char *first,char *last,decimal128_t *dec)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  uint16_t *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  undefined8 uVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  byte *s;
  byte *pbVar18;
  undefined8 unaff_R13;
  type tVar19;
  decimal128_from_chars_result dVar20;
  int local_c8;
  int local_c4;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  undefined8 local_a0;
  uint16_t digits [34];
  bson_uint128_6464_t local_48;
  
  local_48.high = 0;
  local_48.low = 0;
  digits[0x18] = 0;
  digits[0x19] = 0;
  digits[0x1a] = 0;
  digits[0x1b] = 0;
  digits[0x1c] = 0;
  digits[0x1d] = 0;
  digits[0x1e] = 0;
  digits[0x1f] = 0;
  digits[0x10] = 0;
  digits[0x11] = 0;
  digits[0x12] = 0;
  digits[0x13] = 0;
  digits[0x14] = 0;
  digits[0x15] = 0;
  digits[0x16] = 0;
  digits[0x17] = 0;
  digits[0x20] = 0;
  digits[0x21] = 0;
  digits[8] = 0;
  digits[9] = 0;
  digits[10] = 0;
  digits[0xb] = 0;
  digits[0xc] = 0;
  digits[0xd] = 0;
  digits[0xe] = 0;
  digits[0xf] = 0;
  local_c8 = 0;
  digits[0] = 0;
  digits[1] = 0;
  digits[2] = 0;
  digits[3] = 0;
  digits[4] = 0;
  digits[5] = 0;
  digits[6] = 0;
  digits[7] = 0;
  dec->low = 0;
  dec->high = 0;
  cVar3 = *first;
  if ((cVar3 == '-') || (cVar3 == '+')) {
    uVar11 = CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar3 == '-');
    cVar3 = first[1];
    local_b8 = 1;
    s = (byte *)(first + 1);
  }
  else {
    local_b8 = 0;
    uVar11 = 0;
    s = (byte *)first;
  }
  if ((cVar3 != '.') && (9 < (int)cVar3 - 0x30U)) {
    bVar4 = detail::dec128_istreq((char *)s,last,"inf","");
    if ((bVar4) || (bVar4 = detail::dec128_istreq((char *)s,last,"infinity",""), bVar4)) {
      dec->low = 0;
      dec->high = ((ulong)(byte)~(byte)uVar11 << 0x3f) + 0xf800000000000000;
      uVar11 = 0;
    }
    else {
      bVar4 = detail::dec128_istreq((char *)s,last,"nan","");
      dec->low = 0;
      dec->high = 0x7c00000000000000;
      uVar11 = 0x16;
      if (bVar4) {
        uVar11 = 0;
      }
    }
LAB_0019ded9:
    dVar20._8_8_ = uVar11;
    dVar20.ptr = (char *)s;
    return dVar20;
  }
  local_a0 = uVar11;
  local_b0 = 0;
  puVar5 = digits;
  local_c0 = 0;
  local_c4 = 0;
  local_a8 = 0;
  lVar7 = 0;
  bVar2 = 0;
  bVar9 = 0;
LAB_0019dd47:
  pbVar18 = s;
  while( true ) {
    s = pbVar18 + 1;
    bVar1 = *pbVar18;
    uVar13 = (ulong)bVar9;
    if (((char)bVar1 != 0x2e && 9 < (int)(char)bVar1 - 0x30U) ||
       ((long)last - (long)first != -1 && last <= pbVar18)) break;
    if (bVar1 != 0x2e) goto LAB_0019ddaf;
    if (bVar9 != 0) goto LAB_0019de33;
    bVar9 = 1;
    pbVar18 = s;
  }
  if ((bVar9 & lVar7 == 0) == 1) goto LAB_0019de33;
  if ((bVar1 | 0x20) == 0x65) {
    if (*s == 0x2b) {
      s = pbVar18 + 2;
    }
    tVar19 = jsoncons::detail::to_integer<int,char>((char *)s,(long)last - (long)s,&local_c8);
    pbVar18 = (byte *)tVar19.ptr;
    if (tVar19.ec != success) {
      dec->low = 0;
      dec->high = 0x7c00000000000000;
      uVar11 = 0x16;
      goto LAB_0019ded9;
    }
  }
  s = pbVar18;
  pbVar18 = s;
  if ((((long)last - (long)first == -1) || (s < last)) && (*s != 0)) goto LAB_0019de33;
  if ((short)local_b0 == 0) {
    digits._0_8_ = digits._0_8_ & 0xffffffffffff0000;
    uVar6 = 0;
    uVar16 = 1;
    uVar8 = 0;
    uVar17 = uVar16;
  }
  else {
    uVar16 = local_b0 & 0xffff;
    uVar8 = local_a8 + 1;
    pcVar12 = first + uVar13 + local_c0 + local_a8 + local_b8;
    do {
      pcVar12 = pcVar12 + -1;
      uVar8 = uVar8 - 1;
    } while (*pcVar12 == '0');
    uVar6 = (ulong)((int)uVar16 - 1);
    uVar17 = local_a8;
  }
  iVar15 = -0x1820;
  if (-(local_c8 - local_c4) < 0x4001) {
    iVar15 = local_c8 - local_c4;
  }
  iVar10 = local_c8 - local_c4;
  bVar4 = local_c8 < local_c4;
  local_c8 = iVar10;
  if (iVar10 == 0 || bVar4) {
    local_c8 = iVar15;
  }
  for (; 0x17df < local_c8; local_c8 = local_c8 + -1) {
    if (0x21 < uVar6) {
      if (uVar8 == 0) {
        uVar6 = uVar6 + 1;
        local_c8 = 0x17df;
        break;
      }
      goto LAB_0019de33;
    }
    uVar6 = uVar6 + 1;
  }
  do {
    if ((-0x1821 < local_c8) && (uVar17 <= uVar16)) {
      if (uVar6 + 1 < uVar8) {
        if (first[uVar13 + 1 + local_b8 + uVar6 + local_c0] != '0') goto LAB_0019de33;
      }
      else if (uVar8 == 0) goto LAB_0019e07e;
      uVar13 = digits._0_8_ & 0xffff;
      if (uVar6 < 0x11) {
        uVar16 = 0;
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          uVar13 = (ulong)digits[uVar8 + 1] + uVar13 * 10;
        }
      }
      else {
        uVar16 = uVar13;
        for (uVar8 = 0x11; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          uVar16 = (ulong)*(ushort *)((long)&local_b8 + uVar8 * 2) + uVar16 * 10;
        }
        uVar13 = (ulong)*(ushort *)((long)&local_b8 + uVar6 * 2);
        for (uVar8 = uVar6 - 0xf; uVar8 <= uVar6; uVar8 = uVar8 + 1) {
          uVar13 = (ulong)digits[uVar8] + uVar13 * 10;
        }
      }
LAB_0019e087:
      detail::mul_64x64(uVar16,100000000000000000,&local_48);
      uVar8 = local_48.high + CARRY8(uVar13,local_48.low);
      if ((uVar8 & 0x2000000000000) == 0) {
        uVar8 = uVar8 & 0x1ffffffffffff | (ulong)(local_c8 + 0x1820U & 0x3fff) << 0x31 | dec->high;
      }
      else {
        uVar8 = uVar8 & 0x7fffffffffff | 0x6000000000000000 |
                (ulong)(local_c8 + 0x1820U & 0xffff) << 0x2f | dec->high;
      }
      dec->high = uVar8;
      dec->low = uVar13 + local_48.low;
      uVar11 = 0;
      if ((char)local_a0 != '\0') {
        dec->high = uVar8 | 0x8000000000000000;
      }
      goto LAB_0019ded9;
    }
    if (uVar6 == 0) {
      if (uVar8 != 0) goto LAB_0019de33;
      local_c8 = -0x1820;
LAB_0019e07e:
      uVar13 = 0;
      uVar16 = 0;
      goto LAB_0019e087;
    }
    if (uVar17 <= uVar16) {
      if (digits[uVar6] == 0) {
        uVar6 = uVar6 - 1;
        goto LAB_0019dffe;
      }
LAB_0019de33:
      s = pbVar18;
      dec->low = 0;
      dec->high = 0x7c00000000000000;
      uVar11 = 0x16;
      goto LAB_0019ded9;
    }
    if ((uVar8 != 0) && (first[uVar17 + uVar13 + local_b8 + -1] != '0')) goto LAB_0019de33;
    uVar17 = uVar17 - 1;
LAB_0019dffe:
    if (0x17de < local_c8) goto LAB_0019de33;
    local_c8 = local_c8 + 1;
  } while( true );
LAB_0019ddaf:
  if (((ushort)local_b0 < 0x22) && ((bool)(bVar1 != 0x30 | bVar2))) {
    lVar14 = lVar7;
    if (bVar2 != 0) {
      lVar14 = local_c0;
    }
    if (bVar1 != 0x30) {
      local_c0 = lVar14;
    }
    *puVar5 = (short)(char)bVar1 - 0x30;
    puVar5 = puVar5 + 1;
    local_b0 = (ulong)((int)local_b0 + 1);
    bVar2 = 1;
  }
  local_a8 = local_a8 + bVar2;
  local_c4 = local_c4 + (uint)bVar9;
  lVar7 = lVar7 + 1;
  goto LAB_0019dd47;
}

Assistant:

inline
    decimal128_from_chars_result decimal128_from_chars(const char* first, const char* last, decimal128_t& dec) 
    {
        const string_view inf_str = "inf";
        const string_view infinity_str = "infinity";
        const string_view nan_str = "nan";

        ptrdiff_t len = last - first;

        bson_uint128_6464_t significand = {0,0};
 
        const char* str_read = first; /* Read pointer for consuming str. */
 
        /* Parsing state tracking */
        bool is_negative = false;
        bool saw_radix = false;
        bool includes_sign = false; /* True if the input first contains a sign. */
        bool found_nonzero = false;
 
        std::size_t significant_digits = 0; /* Total number of significant digits
                                        * (no leading or trailing zero) */
        std::size_t ndigits_read = 0;       /* Total number of significand digits read */
        std::size_t ndigits = 0;        /* Total number of digits (no leading zeros) */
        std::size_t radix_position = 0; /* The number of the digits after radix */
        std::size_t first_nonzero = 0;  /* The index of the first non-zero in *str* */
 
        uint16_t digits[decimal128_limits::max_digits] = {0};
        uint16_t ndigits_stored = 0;      /* The number of digits in digits */
        uint16_t *digits_insert = digits; /* Insertion pointer for digits */
        std::size_t first_digit = 0;           /* The index of the first non-zero digit */
        std::size_t last_digit = 0;            /* The index of the last digit */
 
        int32_t exponent = 0;
        uint64_t significand_high = 0; /* The high 17 digits of the significand */
        uint64_t significand_low = 0;  /* The low 17 digits of the significand */
        uint16_t biased_exponent = 0;  /* The biased exponent */
 
        dec.high = 0;
        dec.low = 0;
 
        if (*str_read == '+' || *str_read == '-') {
           is_negative = *(str_read++) == '-';
           includes_sign = true;
        }

        /* Check for Infinity or NaN */
        if (!isdigit(*str_read) && *str_read != '.') {
           if (detail::dec128_istreq (str_read, last, inf_str.data(), inf_str.data()+inf_str.length()) ||
               detail::dec128_istreq (str_read, last, infinity_str.data(), infinity_str.data()+infinity_str.length())) 
           {
               dec = is_negative ? decimal128_limits::neg_infinity() : decimal128_limits::infinity();
              return decimal128_from_chars_result{str_read,std::errc()};
           } else if (detail::dec128_istreq (str_read, last, nan_str.data(), nan_str.data()+nan_str.length())) {
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc()};
           }
 
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Read digits */
        while (((isdigit (*str_read) || *str_read == '.')) &&
               (len == -1 || str_read < first + len)) {
           if (*str_read == '.') {
              if (saw_radix) {
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
              saw_radix = true;
              str_read++;
              continue;
           }
 
           if (ndigits_stored < 34) {
              if (*str_read != '0' || found_nonzero) {
                 if (!found_nonzero) {
                    first_nonzero = ndigits_read;
                 }
 
                 found_nonzero = true;
                 *(digits_insert++) = *(str_read) - '0'; /* Only store 34 digits */
                 ndigits_stored++;
              }
           }
 
           if (found_nonzero) {
              ndigits++;
           }
 
           if (saw_radix) {
              radix_position++;
           }
 
           ndigits_read++;
           str_read++;
        }
 
        if (saw_radix && !ndigits_read) {
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Read exponent if exists */
        if (*str_read == 'e' || *str_read == 'E') {
           ++str_read;
           if (*str_read == '+') {
               ++str_read;
           }
           auto result = jsoncons::detail::to_integer(str_read, last - str_read, exponent);
           if (result.ec != jsoncons::detail::to_integer_errc()) 
           {
               dec = decimal128_limits::nan();
               return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
           str_read = result.ptr;
        }

        if ((len == -1 || str_read < first + len) && *str_read) {
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Done reading input. */
        /* Find first non-zero digit in digits */
        first_digit = 0;
 
        if (!ndigits_stored) { /* value is zero */
           first_digit = 0;
           last_digit = 0;
           digits[0] = 0;
           ndigits = 1;
           ndigits_stored = 1;
           significant_digits = 0;
        } else {
           last_digit = ndigits_stored - 1;
           significant_digits = ndigits;
           /* Mark trailing zeros as non-significant */
           while (first[first_nonzero + significant_digits - 1 + includes_sign +
                         saw_radix] == '0') {
              significant_digits--;
           }
        }
 
 
        /* Normalization of exponent */
        /* Correct exponent based on radix position, and shift significand as needed
         */
        /* to represent user input */
 
        /* Overflow prevention */
        if (exponent <= static_cast<int32_t>(radix_position) && static_cast<int32_t>(radix_position) - exponent > (1 << 14)) {
           exponent = decimal128_limits::exponent_min;
        } else {
           exponent -= static_cast<int32_t>(radix_position);
        }
 
        /* Attempt to normalize the exponent */
        while (exponent > decimal128_limits::exponent_max) {
           /* Shift exponent to significand and decrease */
           last_digit++;
 
           if (last_digit - first_digit > decimal128_limits::max_digits) {
              /* The exponent is too great to shift into the significand. */
              if (significant_digits == 0) {
                 /* Value is zero, we are allowed to clamp the exponent. */
                 exponent = decimal128_limits::exponent_max;
                 break;
              }
 
              /* Overflow is not permitted, error. */
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
 
           exponent--;
        }
 
        while (exponent < decimal128_limits::exponent_min || ndigits_stored < ndigits) {
           /* Shift last digit */
           if (last_digit == 0) {
              /* underflow is not allowed, but zero clamping is */
              if (significant_digits == 0) {
                 exponent = decimal128_limits::exponent_min;
                 break;
              }
 
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
 
           if (ndigits_stored < ndigits) {
              if (first[ndigits - 1 + includes_sign + saw_radix] - '0' != 0 &&
                  significant_digits != 0) {
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
              ndigits--; /* adjust to match digits not stored */
           } else {
              if (digits[last_digit] != 0) {
                 /* Inexact rounding is not allowed. */
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
 
              last_digit--; /* adjust to round */
           }
 
           if (exponent < decimal128_limits::exponent_max) {
              exponent++;
           } else {
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
        }
 
        /* Round */
        /* We've normalized the exponent, but might still need to round. */
        if (last_digit - first_digit + 1 < significant_digits) {
           uint8_t round_digit;
 
           /* There are non-zero digits after last_digit that need rounding. */
           /* We round to nearest, ties to even */
           round_digit =
              first[first_nonzero + last_digit + includes_sign + saw_radix + 1] -
              '0';
 
           if (round_digit != 0) {
              /* Inexact (non-zero) rounding is not allowed */
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
        }
 
        /* Encode significand */
        significand_high = 0,   /* The high 17 digits of the significand */
           significand_low = 0; /* The low 17 digits of the significand */
 
        if (significant_digits == 0) { /* read a zero */
           significand_high = 0;
           significand_low = 0;
        } else if (last_digit - first_digit < 17) {
           std::size_t d_idx = first_digit;
           significand_low = digits[d_idx++];
 
           for (; d_idx <= last_digit; d_idx++) {
              significand_low *= 10;
              significand_low += digits[d_idx];
              significand_high = 0;
           }
        } else {
           std::size_t d_idx = first_digit;
           significand_high = digits[d_idx++];
 
           for (; d_idx <= last_digit - 17; d_idx++) {
              significand_high *= 10;
              significand_high += digits[d_idx];
           }
 
           significand_low = digits[d_idx++];
 
           for (; d_idx <= last_digit; d_idx++) {
              significand_low *= 10;
              significand_low += digits[d_idx];
           }
        }
 
        detail::mul_64x64 (significand_high, 100000000000000000ull, &significand);
        significand.low += significand_low;
 
        if (significand.low < significand_low) {
           significand.high += 1;
        }
 
 
        biased_exponent = static_cast<uint16_t>(exponent + static_cast<int32_t>(decimal128_limits::exponent_bias));
 
        /* Encode combination, exponent, and significand. */
        if ((significand.high >> 49) & 1) {
           /* Encode '11' into bits 1 to 3 */
           dec.high |= (0x3ull << 61);
           dec.high |= (biased_exponent & 0x3fffull) << 47;
           dec.high |= significand.high & 0x7fffffffffffull;
        } else {
           dec.high |= (biased_exponent & 0x3fffull) << 49;
           dec.high |= significand.high & 0x1ffffffffffffull;
        }
 
        dec.low = significand.low;
 
        /* Encode sign */
        if (is_negative) {
           dec.high |= 0x8000000000000000ull;
        }
 
        return decimal128_from_chars_result{str_read,std::errc()};
    }